

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalTemplate::ApplyToDecal(FDecalTemplate *this,DBaseDecal *decal,side_t *wall)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 local_2c [4];
  TFlags<ActorRenderFlag,_unsigned_int> local_28;
  TFlags<ActorRenderFlag,_unsigned_int> local_24;
  side_t *local_20;
  side_t *wall_local;
  DBaseDecal *decal_local;
  FDecalTemplate *this_local;
  
  local_20 = wall;
  wall_local = (side_t *)decal;
  decal_local = (DBaseDecal *)this;
  if (((this->RenderStyle).field_0.Flags & 8) != 0) {
    DBaseDecal::SetShade(decal,this->ShadeColor);
  }
  *(DWORD *)((long)&wall_local->textures[2].xOffset + 4) = this->Translation;
  wall_local->textures[1].yScale = this->ScaleX;
  *(double *)&wall_local->textures[1].texture = this->ScaleY;
  *(int *)&wall_local->textures[2].yOffset = (this->PicNum).texnum;
  wall_local->textures[1].interpolation.field_0 =
       (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)this->Alpha;
  *(FRenderStyle *)&wall_local->textures[2].xScale = this->RenderStyle;
  uVar1 = this->RenderFlags;
  uVar3 = *(uint *)((long)&wall_local->textures[2].yOffset + 4);
  ::operator|((EnumType)local_2c,RF_RELMASK);
  TFlags<ActorRenderFlag,_unsigned_int>::operator|(&local_28,(ActorRenderFlag)local_2c);
  TFlags<ActorRenderFlag,_unsigned_int>::operator|(&local_24,(ActorRenderFlag)&local_28);
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24);
  *(uint *)((long)&wall_local->textures[2].yOffset + 4) = uVar1 & 0xfffffcff | uVar3 & uVar2;
  if ((this->RenderFlags & 0x300) != 0) {
    uVar3 = FRandom::operator()(&pr_decal);
    *(uint *)((long)&wall_local->textures[2].yOffset + 4) =
         uVar3 & (int)(this->RenderFlags & 0x300) >> 8 ^
         *(uint *)((long)&wall_local->textures[2].yOffset + 4);
  }
  if (this->Animator != (FDecalAnimator *)0x0) {
    (*this->Animator->_vptr_FDecalAnimator[2])(this->Animator,wall_local,local_20);
  }
  return;
}

Assistant:

void FDecalTemplate::ApplyToDecal (DBaseDecal *decal, side_t *wall) const
{
	if (RenderStyle.Flags & STYLEF_ColorIsFixed)
	{
		decal->SetShade (ShadeColor);
	}
	decal->Translation = Translation;
	decal->ScaleX = ScaleX;
	decal->ScaleY = ScaleY;
	decal->PicNum = PicNum;
	decal->Alpha = Alpha;
	decal->RenderStyle = RenderStyle;
	decal->RenderFlags = (RenderFlags & ~(DECAL_RandomFlipX|DECAL_RandomFlipY)) |
		(decal->RenderFlags & (RF_RELMASK|RF_CLIPMASK|RF_INVISIBLE|RF_ONESIDED));
	if (RenderFlags & (DECAL_RandomFlipX|DECAL_RandomFlipY))
	{
		decal->RenderFlags ^= pr_decal() &
			((RenderFlags & (DECAL_RandomFlipX|DECAL_RandomFlipY)) >> 8);
	}
	if (Animator != NULL)
	{
		Animator->CreateThinker (decal, wall);
	}
}